

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DPIExportSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::DPIExportSyntax,slang::syntax::DPIExportSyntax_const&>
          (BumpAllocator *this,DPIExportSyntax *args)

{
  DPIExportSyntax *pDVar1;
  DPIExportSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pDVar1 = (DPIExportSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::DPIExportSyntax::DPIExportSyntax(in_RSI,pDVar1);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }